

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Preprocessor_pragmas.cpp
# Opt level: O2

pair<slang::syntax::PragmaExpressionSyntax_*,_bool> __thiscall
slang::parsing::Preprocessor::parsePragmaValue(Preprocessor *this)

{
  TokenKind kind;
  Token matchingDelim;
  _Variadic_union<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> _Var1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  ParenPragmaExpressionSyntax *pPVar5;
  SourceLocation SVar6;
  undefined4 extraout_var;
  Info *extraout_RDX;
  SyntaxNode *unaff_RBP;
  ulong uVar8;
  SmallVector<slang::syntax::TokenOrSyntax,_4UL> *args;
  Token *args_00;
  uint uVar9;
  BumpAllocator *pBVar10;
  pair<slang::syntax::PragmaExpressionSyntax_*,_bool> pVar11;
  _Variadic_union<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> _Var12;
  _Variadic_union<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> _Var13;
  Token actual;
  _Variadic_union<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> local_128;
  undefined1 local_118;
  Info *local_110;
  Token local_108;
  Diagnostics *local_f8;
  BumpAllocator *local_f0;
  _Variadic_union<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> local_e8;
  Token openParen;
  Token local_c8;
  SmallVector<slang::syntax::TokenOrSyntax,_4UL> values;
  span<slang::syntax::TokenOrSyntax,_18446744073709551615UL> local_40;
  _Variadic_union<const_slang::syntax::SyntaxNode_*> _Var7;
  Info *src;
  
  pVar11 = checkNextPragmaToken(this);
  pPVar5 = (ParenPragmaExpressionSyntax *)pVar11.first;
  if (((undefined1  [16])pVar11 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    uVar8 = (ulong)pVar11._8_4_;
    goto LAB_0058dad2;
  }
  local_108 = peek(this);
  kind = local_108.kind;
  if ((ushort)(kind - IntegerLiteral) < 2) {
    NumberParser::parseInteger<slang::parsing::Preprocessor,true>
              ((IntResult *)&values,&this->numberParser,this);
    pBVar10 = this->alloc;
    if (values.stackBase[0] == '\x01') {
      args = (SmallVector<slang::syntax::TokenOrSyntax,_4UL> *)
             (values.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.firstElement + 8);
LAB_0058da7a:
      pPVar5 = (ParenPragmaExpressionSyntax *)
               BumpAllocator::
               emplace<slang::syntax::SimplePragmaExpressionSyntax,slang::parsing::Token&>
                         (pBVar10,(Token *)args);
    }
    else {
      pPVar5 = (ParenPragmaExpressionSyntax *)
               BumpAllocator::
               emplace<slang::syntax::NumberPragmaExpressionSyntax,slang::parsing::Token&,slang::parsing::Token&,slang::parsing::Token&>
                         (pBVar10,(Token *)&values,
                          (Token *)&values.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.cap,
                          (Token *)(values.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.
                                    firstElement + 8));
    }
  }
  else {
    if ((kind != Identifier) && (uVar9 = local_108._0_4_ & 0xffff, uVar9 != 4)) {
      if (uVar9 == 8) {
        values.super_SmallVectorBase<slang::syntax::TokenOrSyntax>._0_16_ =
             NumberParser::parseReal<slang::parsing::Preprocessor>(&this->numberParser,this);
        args = &values;
        pBVar10 = this->alloc;
        goto LAB_0058da7a;
      }
      bVar2 = LexerFacts::isKeyword(kind);
      if (!bVar2) {
        if (kind == OpenParenthesis) {
          values.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.len = 0;
          values.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.data_ =
               (pointer)values.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.firstElement;
          values.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.cap = 4;
          _Var12._M_first._M_storage = (_Uninitialized<slang::parsing::Token,_true>)consume(this);
          bVar2 = false;
          openParen = (Token)_Var12._M_first._M_storage;
          while( true ) {
            bVar3 = peekSameLine(this);
            if (!bVar3) break;
            local_108 = peek(this);
            if (bVar2) {
              if (local_108.kind == CloseParenthesis) {
                uVar8 = CONCAT71((int7)((ulong)unaff_RBP >> 8),1);
                goto LAB_0058dc35;
              }
              _Var12._M_first._M_storage =
                   (_Uninitialized<slang::parsing::Token,_true>)expect(this,Comma);
              local_118 = 0;
              local_128._M_first._M_storage = _Var12._M_first._M_storage;
              SmallVectorBase<slang::syntax::TokenOrSyntax>::
              emplace_back<slang::syntax::TokenOrSyntax>
                        (&values.super_SmallVectorBase<slang::syntax::TokenOrSyntax>,
                         (TokenOrSyntax *)&local_128._M_first);
            }
            else {
              pVar11 = parsePragmaExpression(this);
              unaff_RBP = &(pVar11.first)->super_SyntaxNode;
              local_128._M_rest = (_Variadic_union<const_slang::syntax::SyntaxNode_*>)unaff_RBP;
              local_118 = 1;
              SmallVectorBase<slang::syntax::TokenOrSyntax>::
              emplace_back<slang::syntax::TokenOrSyntax>
                        (&values.super_SmallVectorBase<slang::syntax::TokenOrSyntax>,
                         (TokenOrSyntax *)&local_128._M_first);
              if (((undefined1  [16])pVar11 & (undefined1  [16])0x1) == (undefined1  [16])0x0)
              break;
              _Var12._M_first._M_storage =
                   (_Uninitialized<slang::parsing::Token,_true>)
                   slang::syntax::SyntaxNode::getLastToken(unaff_RBP);
            }
            bVar2 = (bool)(bVar2 ^ 1);
          }
          uVar8 = 0;
LAB_0058dc35:
          Token::Token(&local_128._M_first._M_storage);
          bVar2 = peekSameLine(this);
          _Var13._M_first._M_storage.info = extraout_RDX;
          _Var13._M_rest = _Var12._M_rest;
          _Var1 = _Var12;
          if (bVar2) {
            local_110 = _Var12._8_8_;
            _Var13._M_first._M_storage = (_Uninitialized<slang::parsing::Token,_true>)peek(this);
            local_110 = _Var13._8_8_;
            _Var7 = _Var13._M_rest;
            _Var1._M_first._M_storage = _Var13._M_first._M_storage;
            if (_Var13._0_2_ == CloseParenthesis) {
              local_128._M_first._M_storage =
                   (_Uninitialized<slang::parsing::Token,_true>)consume(this);
              _Var13._M_first._M_storage.info = local_128._8_8_;
              _Var13._M_rest = _Var7;
              _Var1._M_first._M_storage.info = local_110;
              _Var1._M_rest = (_Variadic_union<const_slang::syntax::SyntaxNode_*>)0x12;
            }
          }
          local_110 = _Var1._8_8_;
          src = _Var13._8_8_;
          if (local_128._M_first._M_storage.info == (Info *)0x0) {
            local_f0 = this->alloc;
            local_f8 = this->diagnostics;
            local_e8 = _Var12;
            Token::Token(&local_c8);
            actual._0_8_ = (ulong)_Var1._M_rest & 0xffff |
                           (ulong)_Var13._M_rest & 0xffffffffffff0000;
            matchingDelim.info = local_c8.info;
            matchingDelim.kind = local_c8.kind;
            matchingDelim._2_1_ = local_c8._2_1_;
            matchingDelim.numFlags.raw = local_c8.numFlags.raw;
            matchingDelim.rawLen = local_c8.rawLen;
            actual.info = local_110;
            local_128._M_first._M_storage =
                 (_Uninitialized<slang::parsing::Token,_true>)
                 Token::createExpected
                           (local_f0,local_f8,actual,CloseParenthesis,
                            (Token)local_e8._M_first._M_storage,matchingDelim);
            src = local_128._8_8_;
          }
          pBVar10 = this->alloc;
          iVar4 = SmallVectorBase<slang::syntax::TokenOrSyntax>::copy
                            (&values.super_SmallVectorBase<slang::syntax::TokenOrSyntax>,
                             (EVP_PKEY_CTX *)pBVar10,(EVP_PKEY_CTX *)src);
          local_40._M_ptr = (pointer)CONCAT44(extraout_var,iVar4);
          args_00 = &openParen;
          pPVar5 = BumpAllocator::
                   emplace<slang::syntax::ParenPragmaExpressionSyntax,slang::parsing::Token&,std::span<slang::syntax::TokenOrSyntax,18446744073709551615ul>,slang::parsing::Token&>
                             (pBVar10,args_00,&local_40,&local_128._M_first._M_storage);
          SmallVectorBase<slang::syntax::TokenOrSyntax>::cleanup
                    (&values.super_SmallVectorBase<slang::syntax::TokenOrSyntax>,
                     (EVP_PKEY_CTX *)args_00);
        }
        else {
          SVar6 = Token::location(&local_108);
          addDiag(this,(DiagCode)0x80004,SVar6);
          pBVar10 = this->alloc;
          SVar6 = Token::location(&local_108);
          values.super_SmallVectorBase<slang::syntax::TokenOrSyntax>._0_16_ =
               Token::createMissing(pBVar10,Identifier,SVar6);
          pPVar5 = (ParenPragmaExpressionSyntax *)
                   BumpAllocator::
                   emplace<slang::syntax::SimplePragmaExpressionSyntax,slang::parsing::Token&>
                             (this->alloc,(Token *)&values);
          uVar8 = 0;
        }
        goto LAB_0058dad2;
      }
    }
    pBVar10 = this->alloc;
    values.super_SmallVectorBase<slang::syntax::TokenOrSyntax>._0_16_ = consume(this);
    pPVar5 = (ParenPragmaExpressionSyntax *)
             BumpAllocator::
             emplace<slang::syntax::SimplePragmaExpressionSyntax,slang::parsing::Token>
                       (pBVar10,(Token *)&values);
  }
  uVar8 = CONCAT71((int7)((ulong)unaff_RBP >> 8),1);
LAB_0058dad2:
  pVar11._8_8_ = uVar8 & 0xffffffff;
  pVar11.first = &pPVar5->super_PragmaExpressionSyntax;
  return pVar11;
}

Assistant:

std::pair<PragmaExpressionSyntax*, bool> Preprocessor::parsePragmaValue() {
    if (auto pair = checkNextPragmaToken(); !pair.second)
        return pair;

    Token token = peek();
    if (token.kind == TokenKind::IntegerBase || token.kind == TokenKind::IntegerLiteral) {
        PragmaExpressionSyntax* expr;
        auto result = numberParser.parseInteger<Preprocessor, true>(*this);
        if (result.isSimple) {
            expr = alloc.emplace<SimplePragmaExpressionSyntax>(result.value);
        }
        else {
            expr = alloc.emplace<NumberPragmaExpressionSyntax>(result.size, result.base,
                                                               result.value);
        }

        return {expr, true};
    }

    if (token.kind == TokenKind::RealLiteral) {
        auto result = numberParser.parseReal(*this);
        return {alloc.emplace<SimplePragmaExpressionSyntax>(result), true};
    }

    if (token.kind == TokenKind::Identifier || token.kind == TokenKind::StringLiteral ||
        LexerFacts::isKeyword(token.kind)) {
        return {alloc.emplace<SimplePragmaExpressionSyntax>(consume()), true};
    }

    if (token.kind != TokenKind::OpenParenthesis) {
        addDiag(diag::ExpectedPragmaExpression, token.location());

        auto expected = Token::createMissing(alloc, TokenKind::Identifier, token.location());
        return {alloc.emplace<SimplePragmaExpressionSyntax>(expected), false};
    }

    SmallVector<TokenOrSyntax, 4> values;
    Token openParen = consume();
    bool wantComma = false;
    bool ok = false;

    // This keeps track of the last real token we've consumed before
    // breaking from the loop; if there's an error it's possible we've
    // gone on and parsed more directives into the resulting token,
    // so this is necessary to correctly place the diagnostic.
    Token lastToken = openParen;

    while (peekSameLine()) {
        token = peek();
        if (wantComma) {
            if (token.kind == TokenKind::CloseParenthesis) {
                ok = true;
                break;
            }

            Token comma = expect(TokenKind::Comma);
            values.push_back(comma);
            wantComma = false;
            lastToken = comma;
        }
        else {
            auto [expr, succeeded] = parsePragmaExpression();
            values.push_back(expr);
            wantComma = true;

            if (!succeeded)
                break;

            lastToken = expr->getLastToken();
        }
    }

    Token nextUp = lastToken;
    Token closeParen;
    if (peekSameLine()) {
        nextUp = peek();
        if (nextUp.kind == TokenKind::CloseParenthesis)
            closeParen = consume();
    }

    if (!closeParen) {
        closeParen = Token::createExpected(alloc, diagnostics, nextUp, TokenKind::CloseParenthesis,
                                           lastToken, Token());
    }

    return {alloc.emplace<ParenPragmaExpressionSyntax>(openParen, values.copy(alloc), closeParen),
            ok};
}